

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall
google::protobuf::ServiceDescriptorProto::ByteSizeLong(ServiceDescriptorProto *this)

{
  long lVar1;
  Rep *pRVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  long lVar7;
  size_t sVar8;
  void **ppvVar9;
  
  sVar8 = (size_t)(this->method_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->method_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (sVar8 == 0) {
    sVar8 = 0;
  }
  else {
    lVar1 = sVar8 * 8;
    lVar7 = 0;
    do {
      sVar5 = MethodDescriptorProto::ByteSizeLong
                        (*(MethodDescriptorProto **)((long)ppvVar9 + lVar7));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar7 = lVar7 + 8;
    } while (lVar1 - lVar7 != 0);
  }
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 3) != 0) {
    if ((uVar4 & 1) != 0) {
      lVar1 = *(long *)(((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar6 = (uint)lVar1 | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + lVar1 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 2) != 0) {
      sVar5 = ServiceOptions::ByteSizeLong(this->options_);
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar8 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar8,&this->_cached_size_);
  return sVar8;
}

Assistant:

size_t ServiceDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceDescriptorProto)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  total_size += 1UL * this->_internal_method_size();
  for (const auto& msg : this->method_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional .google.protobuf.ServiceOptions options = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}